

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O0

size_t __thiscall io_buf::bin_read_fixed(io_buf *this,char *data,size_t len,char *read_message)

{
  int iVar1;
  uint64_t uVar2;
  undefined8 uVar3;
  char *in_RCX;
  long in_RDX;
  void *in_RSI;
  long in_RDI;
  stringstream __msg;
  char *p;
  string *in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe24;
  char *in_stack_fffffffffffffe28;
  vw_exception *in_stack_fffffffffffffe30;
  io_buf *in_stack_fffffffffffffe38;
  void *in_stack_fffffffffffffe40;
  stringstream local_1b8 [16];
  ostream local_1a8;
  void *local_30;
  char *local_28;
  size_t local_20;
  void *local_18;
  size_t local_8;
  
  if (in_RDX == 0) {
    local_8 = 0;
  }
  else {
    local_28 = in_RCX;
    local_18 = in_RSI;
    local_20 = buf_read(in_stack_fffffffffffffe38,(char **)in_stack_fffffffffffffe30,
                        (size_t)in_stack_fffffffffffffe28);
    if ((*(byte *)(in_RDI + 8) & 1) != 0) {
      uVar2 = uniform_hash(in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38,
                           (uint64_t)in_stack_fffffffffffffe30);
      *(int *)(in_RDI + 0xc) = (int)uVar2;
    }
    if (*local_28 == '\0') {
      memcpy(local_18,local_30,local_20);
    }
    else {
      iVar1 = memcmp(local_18,local_30,local_20);
      if (iVar1 != 0) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::operator<<(&local_1a8,local_28);
        uVar3 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                   in_stack_fffffffffffffe18);
        __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

size_t bin_read_fixed(char* data, size_t len, const char* read_message)
  {
    if (len > 0)
    {
      char* p;
      // if the model is corrupt the number of bytes can be less then specified (as there isn't enought data available
      // in the file)
      len = buf_read(p, len);

      // compute hash for check-sum
      if (_verify_hash)
        _hash = (uint32_t)uniform_hash(p, len, _hash);

      if (*read_message == '\0')
        memcpy(data, p, len);
      else if (memcmp(data, p, len) != 0)
        THROW(read_message);
      return len;
    }
    return 0;
  }